

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_page_manager.h
# Opt level: O0

Region * __thiscall
density::detail::SystemPageManager<65536UL>::get_next_region
          (SystemPageManager<65536UL> *this,progress_guarantee i_progress_guarantee,
          Region *i_curr_region,Region **io_new_region)

{
  long lVar1;
  bool bVar2;
  Region *pRVar3;
  __int_type _Var4;
  __pointer_type local_48;
  Region *expected;
  unsigned_long new_region_size;
  __pointer_type next_region;
  Region **io_new_region_local;
  Region *i_curr_region_local;
  SystemPageManager<65536UL> *pSStack_18;
  progress_guarantee i_progress_guarantee_local;
  SystemPageManager<65536UL> *this_local;
  
  next_region = (__pointer_type)io_new_region;
  io_new_region_local = (Region **)i_curr_region;
  i_curr_region_local._4_4_ = i_progress_guarantee;
  pSStack_18 = this;
  new_region_size =
       (unsigned_long)
       std::atomic<density::detail::SystemPageManager<65536UL>::Region_*>::load
                 (&i_curr_region->m_next_region,memory_order_seq_cst);
  if ((__pointer_type)new_region_size == (__pointer_type)0x0) {
    if (i_curr_region_local._4_4_ != progress_blocking) {
      return (Region *)0x0;
    }
    if ((next_region->m_curr).super___atomic_base<unsigned_long>._M_i == 0) {
      pRVar3 = create_region();
      (next_region->m_curr).super___atomic_base<unsigned_long>._M_i = (__int_type)pRVar3;
    }
    if ((next_region->m_curr).super___atomic_base<unsigned_long>._M_i == 0) {
      new_region_size =
           (unsigned_long)
           std::atomic<density::detail::SystemPageManager<65536UL>::Region_*>::load
                     ((atomic<density::detail::SystemPageManager<65536UL>::Region_*> *)
                      (io_new_region_local + 2),memory_order_seq_cst);
      if ((__pointer_type)new_region_size == (__pointer_type)0x0) {
        return (Region *)0x0;
      }
    }
    else {
      lVar1 = *(long *)((next_region->m_curr).super___atomic_base<unsigned_long>._M_i + 8);
      _Var4 = std::__atomic_base::operator_cast_to_unsigned_long
                        ((__atomic_base *)
                         (next_region->m_curr).super___atomic_base<unsigned_long>._M_i);
      expected = (Region *)(lVar1 - _Var4);
      *(long *)((next_region->m_curr).super___atomic_base<unsigned_long>._M_i + 0x20) =
           (long)io_new_region_local[4] + (long)expected;
      bVar2 = std::atomic<density::detail::SystemPageManager<65536UL>::Region_*>::
              compare_exchange_strong
                        ((atomic<density::detail::SystemPageManager<65536UL>::Region_*> *)
                         (io_new_region_local + 2),(__pointer_type *)&new_region_size,
                         (__pointer_type)
                         (next_region->m_curr).super___atomic_base<unsigned_long>._M_i,
                         memory_order_seq_cst);
      if (bVar2) {
        new_region_size = (next_region->m_curr).super___atomic_base<unsigned_long>._M_i;
        (next_region->m_curr).super___atomic_base<unsigned_long>._M_i = 0;
      }
    }
  }
  local_48 = (__pointer_type)io_new_region_local;
  std::atomic<density::detail::SystemPageManager<65536UL>::Region_*>::compare_exchange_weak
            (&this->m_curr_region,&local_48,(__pointer_type)new_region_size,memory_order_release,
             memory_order_relaxed);
  return (Region *)new_region_size;
}

Assistant:

Region * get_next_region(
              progress_guarantee i_progress_guarantee,
              Region *           i_curr_region,
              Region **          io_new_region) noexcept
            {
                // we get the pointer to the next_region region, or allocate it
                auto next_region = i_curr_region->m_next_region.load();
                if (next_region == nullptr)
                {
                    // check if the user want to allocate memory from the system
                    if (i_progress_guarantee != progress_blocking)
                    {
                        return nullptr;
                    }

                    // allocate a new region, if we don't have one already
                    if (*io_new_region == nullptr)
                    {
                        *io_new_region = create_region();
                    }

                    if (*io_new_region != nullptr)
                    {
                        // set m_cumulative_available_memory on the new region
                        auto const new_region_size =
                          (*io_new_region)->m_end - (*io_new_region)->m_curr;
                        DENSITY_ASSUME_UINT_ALIGNED(new_region_size, page_alignment_and_size);
                        (*io_new_region)->m_cumulative_available_memory =
                          i_curr_region->m_cumulative_available_memory + new_region_size;

                        // The allocation succeeded, so set the pointer to the next_region region, if it is null
                        if (i_curr_region->m_next_region.compare_exchange_strong(
                              next_region, *io_new_region))
                        {
                            next_region    = *io_new_region;
                            *io_new_region = nullptr;
                        }
                    }
                    else
                    {
                        /* We couldn't allocate a new region, check if someone else could in the meanwhile.
                            If not, we give in. Else we continue the loop. */
                        next_region = i_curr_region->m_next_region.load();
                        if (next_region == nullptr)
                        {
                            // allocation failed
                            return nullptr;
                        }
                    }
                }

                /* try to update m_curr_region (if m_curr_region == i_curr_region, then m_curr_region = next_region).
                    This operation is not mandatory, so we can tolerate spurious failures. */
                DENSITY_ASSUME(next_region != nullptr);
                auto expected = i_curr_region;
                m_curr_region.compare_exchange_weak(
                  expected, next_region, std::memory_order_release, std::memory_order_relaxed);

                // we are done we this region
                i_curr_region = next_region;

                return i_curr_region;
            }